

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::operator=(QByteArray *this,char *str)

{
  long lVar1;
  QByteArrayView v;
  char *in_RSI;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  QArrayDataPointer<char> *other;
  QArrayDataPointer<char> *in_stack_ffffffffffffffc8;
  QByteArrayView *in_stack_ffffffffffffffd0;
  QByteArray *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (char *)0x0) {
    QArrayDataPointer<char>::clear(in_stack_ffffffffffffffc8);
  }
  else if (*in_RSI == '\0') {
    other = in_RDI;
    QArrayDataPointer<char>::fromRawData((char *)in_stack_ffffffffffffffc8,(qsizetype)in_RDI);
    QArrayDataPointer<char>::operator=(in_stack_ffffffffffffffc8,other);
    QArrayDataPointer<char>::~QArrayDataPointer(other);
  }
  else {
    QByteArrayView::QByteArrayView<const_char_*,_true>
              (in_stack_ffffffffffffffd0,(char **)in_stack_ffffffffffffffc8);
    v.m_data = (storage_type *)this;
    v.m_size = unaff_retaddr;
    assign(in_stack_ffffffffffffffe0,v);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray &QByteArray::operator=(const char *str)
{
    if (!str) {
        d.clear();
    } else if (!*str) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        assign(str);
    }
    return *this;
}